

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emscripten.c
# Opt level: O0

sexp_conflict
sexp_init_library(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict env,char *version
                 ,char *abi)

{
  undefined8 uVar1;
  int iVar2;
  long in_RDI;
  char *in_R8;
  char *in_R9;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_conflict op;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp_conflict tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict name;
  undefined1 local_80 [16];
  undefined8 local_70;
  undefined1 local_68 [16];
  undefined8 local_58;
  undefined1 local_50 [16];
  undefined8 local_40;
  char *local_38;
  char *local_30;
  long local_10;
  
  local_40 = 0x43e;
  local_38 = in_R9;
  local_30 = in_R8;
  local_10 = in_RDI;
  memset(local_50,0,0x10);
  local_58 = 0x43e;
  memset(local_68,0,0x10);
  local_70 = 0x43e;
  memset(local_80,0,0x10);
  iVar2 = strcmp(local_30,"0.11.0");
  if ((iVar2 == 0) && (iVar2 = strncmp(local_38,"cv-gm*uh",8), iVar2 == 0)) {
    uVar1 = *(undefined8 *)(local_10 + 0x6080);
    *(undefined1 **)(local_10 + 0x6080) = local_50;
    *(undefined1 **)(local_10 + 0x6080) = local_68;
    *(undefined1 **)(local_10 + 0x6080) = local_80;
    *(undefined8 *)(local_10 + 0x6080) = uVar1;
    return (sexp_conflict)0x43e;
  }
  return (sexp_conflict)0xb3e;
}

Assistant:

sexp sexp_init_library (sexp ctx, sexp self, sexp_sint_t n, sexp env, const char* version, const sexp_abi_identifier_t abi) {
  sexp_gc_var3(name, tmp, op);
  if (!(sexp_version_compatible(ctx, version, sexp_version)
        && sexp_abi_compatible(ctx, abi, SEXP_ABI_IDENTIFIER)))
    return SEXP_ABI_ERROR;
  sexp_gc_preserve3(ctx, name, tmp, op);
  sexp_gc_release3(ctx);
  return SEXP_VOID;
}